

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

TValue * debug_localname(lua_State *L,lua_Debug *ar,char **name,BCReg slot1)

{
  uint uVar1;
  BCPos BVar2;
  TValue *pt_00;
  ulong uVar3;
  TValue *pTVar4;
  char *pcVar5;
  uint in_ECX;
  undefined8 *in_RDX;
  long in_RSI;
  lua_State *in_RDI;
  GCproto *pt;
  BCPos pc;
  GCfunc *fn;
  TValue *nextframe;
  TValue *frame;
  uint32_t size;
  uint32_t offset;
  cTValue *local_60;
  
  uVar1 = *(uint *)(in_RSI + 0x74) >> 0x10;
  pt_00 = (TValue *)((ulong)(in_RDI->stack).ptr32 + (ulong)(*(uint *)(in_RSI + 0x74) & 0xffff) * 8);
  if (uVar1 == 0) {
    local_60 = (cTValue *)0x0;
  }
  else {
    local_60 = pt_00 + uVar1;
  }
  uVar1 = (pt_00->u32).lo;
  BVar2 = debug_framepc(in_RDI,(GCfunc *)(ulong)uVar1,local_60);
  if (local_60 == (TValue *)0x0) {
    local_60 = in_RDI->top;
  }
  if ((int)in_ECX < 0) {
    if ((BVar2 != 0xffffffff) &&
       (uVar3 = (ulong)(((GCfunc *)(ulong)uVar1)->c).pc.ptr32, (*(byte *)(uVar3 - 0x1b) & 2) != 0))
    {
      uVar1 = *(byte *)(uVar3 - 0x3a) - in_ECX;
      pTVar4 = pt_00;
      if (((pt_00->field_2).it & 7) == 3) {
        pTVar4 = (TValue *)((long)pt_00 - ((long)(int)(pt_00->field_2).it & 0xfffffffffffffff8U));
        local_60 = pt_00;
      }
      if (pTVar4 + uVar1 < local_60) {
        *in_RDX = "(*vararg)";
        return pTVar4 + uVar1;
      }
    }
    return (TValue *)0x0;
  }
  if (BVar2 != 0xffffffff) {
    pcVar5 = debug_varname((GCproto *)&pt_00->field_2,(BCPos)((ulong)local_60 >> 0x20),
                           (BCReg)local_60);
    *in_RDX = pcVar5;
    if (pcVar5 != (char *)0x0) goto LAB_00116a9a;
  }
  if ((in_ECX != 0) && (pt_00 + in_ECX < local_60)) {
    *in_RDX = "(*temporary)";
  }
LAB_00116a9a:
  return pt_00 + in_ECX;
}

Assistant:

static TValue *debug_localname(lua_State *L, const lua_Debug *ar,
			       const char **name, BCReg slot1)
{
  uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
  uint32_t size = (uint32_t)ar->i_ci >> 16;
  TValue *frame = tvref(L->stack) + offset;
  TValue *nextframe = size ? frame + size : NULL;
  GCfunc *fn = frame_func(frame);
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (!nextframe) nextframe = L->top+LJ_FR2;
  if ((int)slot1 < 0) {  /* Negative slot number is for varargs. */
    if (pc != NO_BCPOS) {
      GCproto *pt = funcproto(fn);
      if ((pt->flags & PROTO_VARARG)) {
	slot1 = pt->numparams + (BCReg)(-(int)slot1);
	if (frame_isvarg(frame)) {  /* Vararg frame has been set up? (pc!=0) */
	  nextframe = frame;
	  frame = frame_prevd(frame);
	}
	if (frame + slot1+LJ_FR2 < nextframe) {
	  *name = "(*vararg)";
	  return frame+slot1;
	}
      }
    }
    return NULL;
  }
  if (pc != NO_BCPOS &&
      (*name = debug_varname(funcproto(fn), pc, slot1-1)) != NULL)
    ;
  else if (slot1 > 0 && frame + slot1+LJ_FR2 < nextframe)
    *name = "(*temporary)";
  return frame+slot1;
}